

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall argstest::NamedBase::~NamedBase(NamedBase *this)

{
  pointer pcVar1;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_0021d988;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->choicesStrings);
  pcVar1 = (this->defaultString)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->defaultString).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  Base::~Base(&this->super_Base);
  return;
}

Assistant:

virtual ~NamedBase() {}